

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModSqrt_test.cpp
# Opt level: O2

void __thiscall
MOD_SQRT_SmallValues_Test::MOD_SQRT_SmallValues_Test(MOD_SQRT_SmallValues_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_0014b380;
  return;
}

Assistant:

TEST(MOD_SQRT, SmallValues) {
    auto primes = eratosthenes_sieve(300);
    for(int p : primes) {
        unordered_set<int> sqrtable;
        rep(a,0,p) sqrtable.insert(a*a);
        for(int a : sqrtable) {
            int s = sqrt(a, p);
            EXPECT_EQ((s*s)%p, a % p);
        }
    }
}